

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathFreeObject(xmlXPathObjectPtr obj)

{
  xmlXPathObjectType xVar1;
  
  if (obj == (xmlXPathObjectPtr)0x0) {
    return;
  }
  xVar1 = obj->type;
  if (xVar1 != XPATH_XSLT_TREE) {
    if (xVar1 == XPATH_STRING) {
      if (obj->stringval != (xmlChar *)0x0) {
        (*xmlFree)(obj->stringval);
      }
      goto LAB_001bbc54;
    }
    if (xVar1 != XPATH_NODESET) goto LAB_001bbc54;
  }
  if (obj->nodesetval != (xmlNodeSetPtr)0x0) {
    xmlXPathFreeNodeSet(obj->nodesetval);
  }
LAB_001bbc54:
  (*xmlFree)(obj);
  return;
}

Assistant:

void
xmlXPathFreeObject(xmlXPathObjectPtr obj) {
    if (obj == NULL) return;
    if ((obj->type == XPATH_NODESET) || (obj->type == XPATH_XSLT_TREE)) {
        if (obj->nodesetval != NULL)
            xmlXPathFreeNodeSet(obj->nodesetval);
    } else if (obj->type == XPATH_STRING) {
	if (obj->stringval != NULL)
	    xmlFree(obj->stringval);
    }
    xmlFree(obj);
}